

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRS.cpp
# Opt level: O2

bool __thiscall Saturation::LRS::shouldUpdateLimits(LRS *this)

{
  char cVar1;
  
  if ((10 < *(uint *)(DAT_00a141a0 + 0x1d0)) &&
     ((shouldUpdateLimits::cnt = shouldUpdateLimits::cnt + 1, shouldUpdateLimits::cnt == 500 ||
      ((cVar1 = (**(code **)(*(long *)&(((this->super_Otter).super_SaturationAlgorithm._passive._M_t
                                         .
                                         super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                         .
                                         super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>
                                        ._M_head_impl)->super_RandomAccessClauseContainer).
                                       super_ClauseContainer + 0x90))(), cVar1 != '\0' &&
       (0x32 < shouldUpdateLimits::cnt)))))) {
    shouldUpdateLimits::cnt = 0;
    return true;
  }
  return false;
}

Assistant:

bool LRS::shouldUpdateLimits()
{
  if (env.statistics->activations <= 10)
    return false;

  static unsigned cnt=0;
  cnt++;

  //when there are limits, we check more frequently so we don't skip too much inferences
  if(cnt==500 || (_passive->limitsActive() && cnt>50 ) ) {
    cnt=0;
    return true;
  }
  return false;
}